

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O0

void __thiscall
pbrt::LightBounds::LightBounds
          (LightBounds *this,Bounds3f *b,Vector3f *w,Float phi,Float theta_o,Float theta_e,
          bool twoSided)

{
  undefined8 uVar1;
  ulong uVar2;
  byte in_CL;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  undefined4 in_XMM0_Da;
  double dVar3;
  undefined1 auVar5 [56];
  undefined1 auVar4 [64];
  uint in_XMM1_Da;
  uint in_XMM2_Da;
  Vector3<float> VVar6;
  
  in_RDI[2] = in_RSI[2];
  uVar2 = in_RSI[1];
  auVar5 = ZEXT856(uVar2);
  *in_RDI = *in_RSI;
  in_RDI[1] = uVar2;
  VVar6 = Normalize<float>((Vector3<float> *)CONCAT44(in_XMM0_Da,in_XMM1_Da));
  auVar4._0_8_ = VVar6.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar4._8_56_ = auVar5;
  uVar1 = vmovlpd_avx(auVar4._0_16_);
  in_RDI[3] = uVar1;
  *(float *)(in_RDI + 4) = VVar6.super_Tuple3<pbrt::Vector3,_float>.z;
  *(undefined4 *)((long)in_RDI + 0x24) = in_XMM0_Da;
  *(uint *)(in_RDI + 5) = in_XMM1_Da;
  *(uint *)((long)in_RDI + 0x2c) = in_XMM2_Da;
  dVar3 = std::cos((double)(ulong)in_XMM1_Da);
  *(int *)(in_RDI + 6) = SUB84(dVar3,0);
  dVar3 = std::cos((double)(ulong)in_XMM2_Da);
  *(int *)((long)in_RDI + 0x34) = SUB84(dVar3,0);
  *(byte *)(in_RDI + 7) = in_CL & 1;
  return;
}

Assistant:

LightBounds(const Bounds3f &b, const Vector3f &w, Float phi, Float theta_o,
                Float theta_e, bool twoSided)
        : b(b),
          w(Normalize(w)),
          phi(phi),
          theta_o(theta_o),
          theta_e(theta_e),
          cosTheta_o(std::cos(theta_o)),
          cosTheta_e(std::cos(theta_e)),
          twoSided(twoSided) {}